

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_reporting.hpp
# Opt level: O0

error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
* __thiscall
pstore::http::
send_error_page<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
          (error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
           *__return_storage_ptr__,http *this,
          _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
          *sender,reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>
                  io,czstring cause,http_status_code error_no,czstring shortmsg,czstring longmsg)

{
  anon_class_24_3_4e63f42d f;
  czstring this_00;
  ostream *poVar1;
  unsigned_long __val;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> text;
  string *str;
  undefined4 in_register_0000008c;
  undefined1 auVar2 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
  *local_328;
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  local_320;
  czstring *local_308;
  undefined1 *puStack_300;
  string *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 local_2a0 [8];
  array<std::pair<const_char_*,_const_char_*>,_5UL> h;
  string content_length;
  string status_line;
  undefined1 local_208 [8];
  string now;
  string *content_str;
  ostringstream local_1b0 [8];
  ostringstream content;
  czstring shortmsg_local;
  http_status_code error_no_local;
  czstring cause_local;
  _func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
  *sender_local;
  reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_> io_local
  ;
  
  text._M_data = io._M_data;
  str = (string *)cause;
  cause_local = (czstring)this;
  sender_local = sender;
  io_local._M_data = (descriptor<pstore::details::posix_descriptor_traits> *)__return_storage_ptr__;
  std::__cxx11::ostringstream::ostringstream(local_1b0);
  poVar1 = std::operator<<((ostream *)local_1b0,
                           "<!DOCTYPE html>\n<html lang=\"en\"><head>\n<meta charset=\"utf-8\">\n<title>"
                          );
  poVar1 = std::operator<<(poVar1,"pstore-http");
  poVar1 = std::operator<<(poVar1," Error</title>\n</head>\n<body>\n<h1>");
  poVar1 = std::operator<<(poVar1,"pstore-http");
  poVar1 = std::operator<<(poVar1," Web Server Error</h1>\n<p>");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)cause);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,(char *)CONCAT44(in_register_0000008c,error_no));
  poVar1 = std::operator<<(poVar1,"</p><p>");
  poVar1 = std::operator<<(poVar1,shortmsg);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,(char *)io._M_data);
  poVar1 = std::operator<<(poVar1,"</p>\n<hr>\n<em>The ");
  poVar1 = std::operator<<(poVar1,"pstore-http");
  std::operator<<(poVar1," Web server</em>\n</body>\n</html>\n");
  std::__cxx11::ostringstream::str();
  auVar2 = std::chrono::_V2::system_clock::now();
  http_date_abi_cxx11_((string *)local_208,auVar2._0_8_,(duration)auVar2._8_8_);
  build_status_line_abi_cxx11_
            ((string *)((long)&content_length.field_2 + 8),(http *)((ulong)cause & 0xffffffff),
             0x166b30,(czstring)text._M_data);
  __val = std::__cxx11::string::length();
  std::__cxx11::to_string((string *)&h._M_elems[4].second,__val);
  local_2a8 = "Content-length";
  local_2b0 = (char *)std::__cxx11::string::c_str();
  std::pair<const_char_*,_const_char_*>::pair<const_char_*,_true>
            ((pair<const_char_*,_const_char_*> *)local_2a0,&local_2a8,&local_2b0);
  local_2b8 = "Connection";
  local_2c0 = "close";
  std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*,_true>
            ((pair<const_char_*,_const_char_*> *)&h._M_elems[0].second,&local_2b8,&local_2c0);
  local_2c8 = "Content-type";
  local_2d0 = "text/html";
  std::pair<const_char_*,_const_char_*>::pair<const_char_*,_const_char_*,_true>
            ((pair<const_char_*,_const_char_*> *)&h._M_elems[1].second,&local_2c8,&local_2d0);
  local_2d8 = "Date";
  local_2e0 = (char *)std::__cxx11::string::c_str();
  std::pair<const_char_*,_const_char_*>::pair<const_char_*,_true>
            ((pair<const_char_*,_const_char_*> *)&h._M_elems[2].second,&local_2d8,&local_2e0);
  local_2e8 = "Last-Modified";
  local_2f0 = (char *)std::__cxx11::string::c_str();
  std::pair<const_char_*,_const_char_*>::pair<const_char_*,_true>
            ((pair<const_char_*,_const_char_*> *)&h._M_elems[3].second,&local_2e8,&local_2f0);
  this_00 = cause_local;
  local_308 = &cause_local;
  puStack_300 = local_2a0;
  local_328 = sender_local;
  local_2f8 = (string *)((long)&now.field_2 + 8);
  std::operator+(&local_348,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&content_length.field_2 + 8),"\r\n");
  send<pstore::error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>&>(*)(pstore::details::descriptor<pstore::details::posix_descriptor_traits>&,pstore::gsl::span<unsigned_char_const,_1l>const&),std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>>>
            (&local_320,(http *)this_00,local_328,
             (descriptor<pstore::details::posix_descriptor_traits> *)&local_348,str);
  f.h = (array<std::pair<const_char_*,_const_char_*>,_5UL> *)puStack_300;
  f.sender = (_func_error_or<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_&>_descriptor<pstore::details::posix_descriptor_traits>_ptr_span<const_unsigned_char,__1L>_ptr
              **)local_308;
  f.content_str = local_2f8;
  pstore::operator>>=(__return_storage_ptr__,&local_320,f);
  error_or<std::reference_wrapper<pstore::details::descriptor<pstore::details::posix_descriptor_traits>_>_>
  ::~error_or(&local_320);
  std::__cxx11::string::~string((string *)&local_348);
  std::__cxx11::string::~string((string *)&h._M_elems[4].second);
  std::__cxx11::string::~string((string *)(content_length.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_208);
  std::__cxx11::string::~string((string *)(now.field_2._M_local_buf + 8));
  std::__cxx11::ostringstream::~ostringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

error_or<IO> send_error_page (Sender sender, IO io, gsl::czstring const cause,
                                      http_status_code const error_no, gsl::czstring const shortmsg,
                                      gsl::czstring const longmsg) {
            using status_type = std::underlying_type_t<http_status_code>;
            std::ostringstream content;
            content << "<!DOCTYPE html>\n"
                       "<html lang=\"en\">"
                       "<head>\n"
                       "<meta charset=\"utf-8\">\n"
                       "<title>"
                    << server_name
                    << " Error</title>\n"
                       "</head>\n"
                       "<body>\n"
                       "<h1>"
                    << server_name
                    << " Web Server Error</h1>\n"
                       "<p>"
                    << static_cast<status_type> (error_no) << ": " << shortmsg
                    << "</p>"
                       "<p>"
                    << longmsg << ": " << cause
                    << "</p>\n"
                       "<hr>\n"
                       "<em>The "
                    << server_name
                    << " Web server</em>\n"
                       "</body>\n"
                       "</html>\n";
            std::string const & content_str = content.str ();

            auto const now = http_date (std::chrono::system_clock::now ());
            auto const status_line = build_status_line (error_no, "OK");

            auto const content_length = std::to_string (content_str.length ());
            std::array<czstring_pair, 5> const h{{
                {"Content-length", content_length.c_str ()},
                {"Connection", "close"}, // TODO remove this when we support persistent connections
                {"Content-type", "text/html"},
                {"Date", now.c_str ()},
                {"Last-Modified", now.c_str ()},
            }};

            // Send the three parts: the response line, the headers, and the HTML content.
            return send (sender, io, status_line + crlf) >>= [&] (IO io2) {
                return send (sender, io2, build_headers (std::begin (h), std::end (h))) >>=
                       [&] (IO io3) { return send (sender, io3, content_str); };
            };
        }